

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool-gnu-make-posix.cc
# Opt level: O0

bool __thiscall GNUmakeTokenPoolPosix::ParseAuth(GNUmakeTokenPoolPosix *this,char *jobserver)

{
  bool bVar1;
  int iVar2;
  int local_28;
  int local_24;
  int wfd;
  int rfd;
  char *jobserver_local;
  GNUmakeTokenPoolPosix *this_local;
  
  local_24 = -1;
  local_28 = -1;
  _wfd = jobserver;
  jobserver_local = (char *)this;
  iVar2 = __isoc99_sscanf(jobserver,"%*[^=]=%d,%d",&local_24,&local_28);
  if ((((iVar2 == 2) && (bVar1 = CheckFd(this,local_24), bVar1)) &&
      (bVar1 = CheckFd(this,local_28), bVar1)) && (bVar1 = SetAlarmHandler(this), bVar1)) {
    this->rfd_ = local_24;
    this->wfd_ = local_28;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool GNUmakeTokenPoolPosix::ParseAuth(const char* jobserver) {
  int rfd = -1;
  int wfd = -1;
  if ((sscanf(jobserver, "%*[^=]=%d,%d", &rfd, &wfd) == 2) &&
      CheckFd(rfd) &&
      CheckFd(wfd) &&
      SetAlarmHandler()) {
    rfd_ = rfd;
    wfd_ = wfd;
    return true;
  }

  return false;
}